

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O0

bool __thiscall
OpenMD::Component::findMoleculeStamp
          (Component *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
          *molStamps)

{
  bool bVar1;
  pointer ppVar2;
  long in_RDI;
  const_iterator i;
  bool ret;
  Component *in_stack_ffffffffffffff78;
  _Self local_60 [3];
  string local_48 [32];
  _Base_ptr local_28;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>
  local_20;
  byte local_11;
  
  local_11 = 0;
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>
  ::_Rb_tree_const_iterator(&local_20);
  getType_abi_cxx11_(in_stack_ffffffffffffff78);
  local_28 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
                     *)in_stack_ffffffffffffff78,(key_type *)0x34814d);
  local_20._M_node = local_28;
  std::__cxx11::string::~string(local_48);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
              *)in_stack_ffffffffffffff78);
  bVar1 = std::operator!=(&local_20,local_60);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>
                           *)0x3481a0);
    *(MoleculeStamp **)(in_RDI + 0x118) = ppVar2->second;
    local_11 = 1;
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool Component::findMoleculeStamp(
      const std::map<std::string, MoleculeStamp*>& molStamps) {
    bool ret = false;
    std::map<std::string, MoleculeStamp*>::const_iterator i;
    i = molStamps.find(getType());
    if (i != molStamps.end()) {
      moleculeStamp_ = i->second;
      ret            = true;
    }
    return ret;
  }